

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rnn.c
# Opt level: O1

rnndelem * copydelem(rnndelem *elem,char *file)

{
  int iVar1;
  uint64_t uVar2;
  char *pcVar3;
  char *pcVar4;
  char *pcVar5;
  rnnenum *prVar6;
  char *pcVar7;
  rnnaccess rVar8;
  int iVar9;
  undefined4 uVar10;
  rnndelem *prVar11;
  rnndelem **pprVar12;
  rnndelem *prVar13;
  long lVar14;
  int iVar15;
  bool bVar16;
  
  prVar11 = (rnndelem *)calloc(0x108,1);
  prVar11->type = elem->type;
  prVar11->name = elem->name;
  rVar8 = elem->access;
  prVar11->width = elem->width;
  prVar11->access = rVar8;
  uVar2 = elem->length;
  prVar11->offset = elem->offset;
  prVar11->length = uVar2;
  prVar11->stride = elem->stride;
  pcVar3 = (elem->varinfo).prefixstr;
  pcVar4 = (elem->varinfo).varsetstr;
  pcVar5 = (elem->varinfo).variantsstr;
  iVar9 = (elem->varinfo).dead;
  uVar10 = *(undefined4 *)&(elem->varinfo).field_0x1c;
  prVar6 = (elem->varinfo).prefenum;
  pcVar7 = (elem->varinfo).prefix;
  iVar1 = (elem->varinfo).varsetsnum;
  iVar15 = (elem->varinfo).varsetsmax;
  (prVar11->varinfo).varsets = (elem->varinfo).varsets;
  (prVar11->varinfo).varsetsnum = iVar1;
  (prVar11->varinfo).varsetsmax = iVar15;
  (prVar11->varinfo).prefenum = prVar6;
  (prVar11->varinfo).prefix = pcVar7;
  (prVar11->varinfo).variantsstr = pcVar5;
  (prVar11->varinfo).dead = iVar9;
  *(undefined4 *)&(prVar11->varinfo).field_0x1c = uVar10;
  (prVar11->varinfo).prefixstr = pcVar3;
  (prVar11->varinfo).varsetstr = pcVar4;
  prVar11->file = file;
  copytypeinfo(&prVar11->typeinfo,&elem->typeinfo,file);
  if (0 < elem->subelemsnum) {
    iVar1 = prVar11->subelemsnum;
    iVar15 = prVar11->subelemsmax;
    lVar14 = 0;
    do {
      if ((long)iVar15 <= iVar1 + lVar14) {
        bVar16 = iVar15 == 0;
        iVar15 = iVar15 * 2;
        if (bVar16) {
          iVar15 = 0x10;
        }
        pprVar12 = (rnndelem **)realloc(prVar11->subelems,(long)iVar15 << 3);
        prVar11->subelems = pprVar12;
      }
      prVar13 = copydelem(elem->subelems[lVar14],file);
      prVar11->subelems[iVar1 + lVar14] = prVar13;
      lVar14 = lVar14 + 1;
    } while (lVar14 < elem->subelemsnum);
    prVar11->subelemsnum = iVar1 + (int)lVar14;
    prVar11->subelemsmax = iVar15;
  }
  return prVar11;
}

Assistant:

static struct rnndelem *copydelem (struct rnndelem *elem, char *file) {
	struct rnndelem *res = calloc (sizeof *res, 1);
	res->type = elem->type;
	res->name = elem->name;
	res->width = elem->width;
	res->access = elem->access;
	res->offset = elem->offset;
	res->length = elem->length;
	res->stride = elem->stride;
	res->varinfo = elem->varinfo;
	res->file = file;
	copytypeinfo(&res->typeinfo, &elem->typeinfo, file);
	int i;
	for (i = 0; i < elem->subelemsnum; i++)
		ADDARRAY(res->subelems, copydelem(elem->subelems[i], file));
	return res;
}